

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlvoid.c
# Opt level: O0

err_t RenderData(ebml_master *Element,stream *Output,bool_t bForceWithoutMandatory,
                bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  code *pcVar1;
  stream *Any;
  bool_t bVar2;
  ebml_context *Context;
  long lVar3;
  filepos_t fVar4;
  long local_a8;
  uint8_t *Data;
  filepos_t CrcSize_1;
  filepos_t VirtualPos;
  size_t Written;
  filepos_t CrcSize;
  filepos_t Offset;
  stream *VOutput;
  ebml_crc *CrcElt;
  bool_t IsMemory;
  array TmpBuf;
  err_t Err;
  filepos_t _Rendered;
  filepos_t *Rendered_local;
  nodetree *pnStack_30;
  int ForProfile_local;
  bool_t bWithDefault_local;
  bool_t bForceWithoutMandatory_local;
  stream *Output_local;
  ebml_master *Element_local;
  
  TmpBuf._Used = 0;
  _Rendered = (filepos_t)Rendered;
  if (Rendered == (filepos_t *)0x0) {
    _Rendered = (filepos_t)&Err;
  }
  Rendered_local._4_4_ = ForProfile;
  pnStack_30 = (nodetree *)bWithDefault;
  bWithDefault_local = bForceWithoutMandatory;
  bForceWithoutMandatory_local = (bool_t)Output;
  Output_local = (stream *)Element;
  *(undefined8 *)_Rendered = 0;
  if ((bWithDefault_local == 0) &&
     (bVar2 = CheckMandatory((ebml_master *)Output_local,(bool_t)pnStack_30,Rendered_local._4_4_),
     bVar2 == 0)) {
    __assert_fail("CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x1d9,
                  "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  if (*(int *)(Output_local->URL + 0x48) == 0) {
    TmpBuf._Used = InternalRender((ebml_master *)Output_local,(stream *)bForceWithoutMandatory_local
                                  ,bWithDefault_local,(bool_t)pnStack_30,Rendered_local._4_4_,
                                  (filepos_t *)_Rendered);
  }
  else {
    CrcElt = (ebml_crc *)Node_IsPartOf((void *)bForceWithoutMandatory_local,0x534d454d);
    Element_local = (ebml_master *)&IsMemory;
    IsMemory = 0;
    TmpBuf._Begin = (char *)0x0;
    if ((CrcElt == (ebml_crc *)0x0) &&
       (bVar2 = ArrayResize((array *)&IsMemory,*(long *)(Output_local->URL + 0x18) - 6,0),
       bVar2 == 0)) {
      TmpBuf._Used = 0xfffffffffffffffe;
    }
    else {
      Any = Output_local;
      Context = EBML_getContextEbmlCrc32();
      VOutput = (stream *)EBML_ElementCreate(Any,Context,0,Rendered_local._4_4_);
      if (VOutput == (stream *)0x0) {
        TmpBuf._Used = 0xfffffffffffffffe;
      }
      else {
        if (CrcElt == (ebml_crc *)0x0) {
          Offset = (filepos_t)NodeCreate(Output_local,0x534d454d);
          if ((node *)Offset == (node *)0x0) {
            TmpBuf._Used = 0xfffffffffffffffe;
          }
          else {
            if (bForceWithoutMandatory_local == 0) {
              __assert_fail("(const void*)(Output)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x1fb,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            lVar3 = (**(code **)(*(long *)(bForceWithoutMandatory_local + 8) + 0x78))
                              (bForceWithoutMandatory_local,0,1);
            CrcSize = lVar3 + 6;
            if (Offset == 0) {
              __assert_fail("(const void*)(VOutput)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x1fc,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            (**(code **)(*(long *)(Offset + 8) + 0x20))(Offset,0x100,IsMemory,TmpBuf._Begin);
            if (Offset == 0) {
              __assert_fail("(const void*)(VOutput)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x1fd,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            (**(code **)(*(long *)(Offset + 8) + 0x20))(Offset,0x102,&CrcSize,8);
            TmpBuf._Used = InternalRender((ebml_master *)Output_local,(stream *)Offset,
                                          bWithDefault_local,(bool_t)pnStack_30,Rendered_local._4_4_
                                          ,(filepos_t *)_Rendered);
            if ((TmpBuf._Used == 0) && (*(char **)_Rendered != TmpBuf._Begin)) {
              __assert_fail("Err!=ERR_NONE || *Rendered == (filepos_t)ARRAYCOUNT(TmpBuf,uint8_t)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x1ff,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            if (TmpBuf._Used == 0) {
              EBML_CRCAddBuffer((ebml_crc *)VOutput,(void *)IsMemory,(size_t)TmpBuf._Begin);
              EBML_CRCFinalize((ebml_crc *)VOutput);
              TmpBuf._Used = EBML_ElementRender((ebml_element *)VOutput,
                                                (stream *)bForceWithoutMandatory_local,
                                                (bool_t)pnStack_30,0,bWithDefault_local,
                                                Rendered_local._4_4_,(filepos_t *)&Written);
              if (TmpBuf._Used == 0) {
                if (bForceWithoutMandatory_local == 0) {
                  __assert_fail("(const void*)(Output)!=NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                ,0x209,
                                "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                               );
                }
                TmpBuf._Used = (**(code **)(*(long *)(bForceWithoutMandatory_local + 8) + 0x70))
                                         (bForceWithoutMandatory_local,IsMemory,TmpBuf._Begin,
                                          &VirtualPos);
                if ((TmpBuf._Used == 0) && (VirtualPos != *(long *)_Rendered)) {
                  __assert_fail("Err!=ERR_NONE || (filepos_t)Written == *Rendered",
                                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                ,0x20a,
                                "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                               );
                }
                *(size_t *)_Rendered = VirtualPos + Written;
              }
            }
            StreamClose((stream *)Offset);
          }
        }
        else {
          if (bForceWithoutMandatory_local == 0) {
            __assert_fail("(const void*)(Output)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                          ,0x213,
                          "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          CrcSize_1 = (**(code **)(*(long *)(bForceWithoutMandatory_local + 8) + 0x78))
                                (bForceWithoutMandatory_local,6,1);
          TmpBuf._Used = InternalRender((ebml_master *)Output_local,
                                        (stream *)bForceWithoutMandatory_local,bWithDefault_local,
                                        (bool_t)pnStack_30,Rendered_local._4_4_,
                                        (filepos_t *)_Rendered);
          if (TmpBuf._Used == 0) {
            if (bForceWithoutMandatory_local == 0) {
              __assert_fail("(const void*)(Output)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x219,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            (**(code **)(*(long *)(bForceWithoutMandatory_local + 8) + 0x18))
                      (bForceWithoutMandatory_local,0x102,&Data,8);
            if (bForceWithoutMandatory_local == 0) {
              __assert_fail("(const void*)(Output)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x21a,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            (**(code **)(*(long *)(bForceWithoutMandatory_local + 8) + 0x18))
                      (bForceWithoutMandatory_local,0x101,&local_a8,8);
            EBML_CRCAddBuffer((ebml_crc *)VOutput,(void *)(local_a8 + (CrcSize_1 - (long)Data)),
                              *(long *)(Output_local->URL + 0x18) - 6);
            EBML_CRCFinalize((ebml_crc *)VOutput);
            bVar2 = bForceWithoutMandatory_local;
            if (bForceWithoutMandatory_local == 0) {
              __assert_fail("(const void*)(Output)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x21d,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            pcVar1 = *(code **)(*(long *)(bForceWithoutMandatory_local + 8) + 0x78);
            fVar4 = EBML_ElementPositionData((ebml_element *)Output_local);
            (*pcVar1)(bVar2,fVar4,0);
            TmpBuf._Used = EBML_ElementRender((ebml_element *)VOutput,
                                              (stream *)bForceWithoutMandatory_local,
                                              (bool_t)pnStack_30,0,bWithDefault_local,
                                              Rendered_local._4_4_,(filepos_t *)&Data);
            *(uint8_t **)_Rendered = Data + *(long *)_Rendered;
            bVar2 = bForceWithoutMandatory_local;
            if (bForceWithoutMandatory_local == 0) {
              __assert_fail("(const void*)(Output)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x220,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            pcVar1 = *(code **)(*(long *)(bForceWithoutMandatory_local + 8) + 0x78);
            fVar4 = EBML_ElementPositionEnd((ebml_element *)Output_local);
            (*pcVar1)(bVar2,fVar4,0);
          }
        }
        NodeDelete(&VOutput->Base);
      }
    }
    ArrayClear((array *)&IsMemory);
  }
  return TmpBuf._Used;
}

Assistant:

static err_t RenderData(ebml_element *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    size_t Written, Left = (size_t)Element->DataSize;
    err_t Err = ERR_NONE;
    uint8_t Buf[2*1024]; // write 2 KB chunks at a time
    memset(Buf,0,sizeof(Buf));
    while (Err==ERR_NONE && Left)
    {
        Err = Stream_Write(Output,Buf,MIN(Left,sizeof(Buf)),&Written);
        if (Err == ERR_NONE)
            Left -= MIN(Left,sizeof(Buf));
    }
    if (Rendered)
        *Rendered = Element->DataSize - Left;
    return Err;
}